

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall EventQueue::Remove(EventQueue *this,Id id)

{
  bool bVar1;
  Id IVar2;
  Event **ppEVar3;
  iterator local_58;
  list<Event_*> local_50;
  undefined1 local_38 [8];
  iterator i;
  AutoLock _auto_lock_;
  Id id_local;
  EventQueue *this_local;
  
  AutoLock::AutoLock((AutoLock *)&i,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x83);
  JetHead::list<Event_*>::begin((list<Event_*> *)local_38);
  while( true ) {
    JetHead::list<Event_*>::end(&local_50);
    bVar1 = JetHead::list<Event_*>::iterator::operator!=((iterator *)local_38,(iterator *)&local_50)
    ;
    JetHead::list<Event_*>::iterator::~iterator((iterator *)&local_50);
    if (!bVar1) break;
    ppEVar3 = JetHead::list<Event_*>::iterator::operator*((iterator *)local_38);
    IVar2 = Event::getEventId(*ppEVar3);
    if (IVar2 == id) {
      ppEVar3 = JetHead::list<Event_*>::iterator::operator*((iterator *)local_38);
      RefCount::Release(&(*ppEVar3)->super_RefCount);
      JetHead::list<Event_*>::iterator::erase(&local_58);
      local_38 = (undefined1  [8])local_58.mNode;
      JetHead::list<Event_*>::iterator::~iterator(&local_58);
      JetHead::list<Event_*>::iterator::operator--((iterator *)local_38);
    }
    JetHead::list<Event_*>::iterator::operator++((iterator *)local_38);
  }
  JetHead::list<Event_*>::iterator::~iterator((iterator *)local_38);
  AutoLock::~AutoLock((AutoLock *)&i);
  return;
}

Assistant:

void EventQueue::Remove( Event::Id id )
{
	DebugAutoLock( mLock );
	
	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i)->getEventId() == id)
		{
			(*i)->Release();
			i = i.erase();
			--i;
		}
	}
}